

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::ValidationState_t
          (ValidationState_t *this,spv_const_context ctx,spv_const_validator_options opt,
          uint32_t *words,size_t num_words,uint32_t max_warnings)

{
  bool bVar1;
  pointer this_00;
  NameMapper local_c8;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  local_a8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  local_a0;
  anon_class_1_0_00000001 local_79;
  undefined1 local_78 [8];
  spv_context_t hijacked_context;
  spv_target_env env;
  uint32_t max_warnings_local;
  size_t num_words_local;
  uint32_t *words_local;
  spv_const_validator_options opt_local;
  spv_const_context ctx_local;
  ValidationState_t *this_local;
  
  this->context_ = ctx;
  this->options_ = opt;
  this->words_ = words;
  this->num_words_ = num_words;
  this->generator_ = 0;
  this->version_ = 0;
  this->total_instructions_ = 0;
  this->total_functions_ = 0;
  hijacked_context.consumer._M_invoker._4_4_ = max_warnings;
  memset(&this->unresolved_forward_ids_,0,0x38);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->unresolved_forward_ids_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->forward_pointer_ids_);
  std::
  unordered_map<unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>_>_>_>
  ::unordered_map(&this->sampled_image_consumers_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->qcom_image_processing_consumers_);
  memset(&this->operand_names_,0,0x38);
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->operand_names_);
  this->current_layout_section_ = kLayoutCapabilities;
  memset(&this->module_functions_,0,0x18);
  std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::vector
            (&this->module_functions_);
  EnumSet<spv::Capability>::EnumSet(&this->module_capabilities_);
  EnumSet<spvtools::Extension>::EnumSet(&this->module_extensions_);
  memset(&this->ordered_instructions_,0,0x18);
  std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::vector
            (&this->ordered_instructions_);
  memset(&this->all_definitions_,0,0x38);
  std::
  unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
  ::unordered_map(&this->all_definitions_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->entry_points_);
  std::
  unordered_map<unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>_>
  ::unordered_map(&this->entry_point_descriptions_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->recursive_entry_points_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->function_call_targets_);
  memset(&this->global_vars_,0,0x38);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->global_vars_);
  memset(&this->local_vars_,0,0x38);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->local_vars_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->builtin_structs_);
  memset(&this->struct_nesting_depth_,0,0x38);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->struct_nesting_depth_);
  memset(&this->struct_has_nested_blockorbufferblock_struct_,0,0x38);
  std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::unordered_map(&this->struct_has_nested_blockorbufferblock_struct_);
  std::
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  ::map(&this->id_decorations_);
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set(&this->unique_type_declarations_);
  AssemblyGrammar::AssemblyGrammar(&this->grammar_,ctx);
  this->addressing_model_ = AddressingModelMax;
  this->memory_model_ = Max;
  this->pointer_size_and_alignment_ = 0;
  this->sampler_image_addressing_mode_ = 0;
  this->in_function_ = false;
  Feature::Feature(&this->features_);
  std::
  unordered_map<unsigned_int,_spvtools::val::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>_>
  ::unordered_map(&this->id_to_function_);
  std::
  unordered_map<unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>_>
  ::unordered_map(&this->entry_point_to_execution_models_);
  std::
  unordered_map<unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>_>
  ::unordered_map(&this->entry_point_to_execution_modes_);
  std::
  unordered_map<unsigned_int,_const_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>_>
  ::unordered_map(&this->entry_point_to_local_size_or_id_);
  std::
  unordered_map<unsigned_int,_const_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>_>
  ::unordered_map(&this->entry_point_to_output_primitives_);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->function_to_entry_points_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->empty_ids_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->pointer_to_uniform_block_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->struct_for_uniform_block_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->pointer_to_storage_buffer_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->struct_for_storage_buffer_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->pointer_to_storage_image_);
  std::unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>::
  unique_ptr<std::default_delete<spvtools::FriendlyNameMapper>,void>
            ((unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>
              *)&this->friendly_mapper_);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::function(&this->name_mapper_);
  this->num_of_warnings_ = 0;
  this->max_num_of_warnings_ = hijacked_context.consumer._M_invoker._4_4_;
  if (opt != (spv_const_validator_options)0x0) {
    hijacked_context.consumer._M_invoker._0_4_ = this->context_->target_env;
    bVar1 = spvIsVulkanEnv((spv_target_env)hijacked_context.consumer._M_invoker);
    if ((bVar1) && ((spv_target_env)hijacked_context.consumer._M_invoker != SPV_ENV_VULKAN_1_0)) {
      (this->features_).env_relaxed_block_layout = true;
    }
    if (((((spv_target_env)hijacked_context.consumer._M_invoker == SPV_ENV_VULKAN_1_0) ||
         ((spv_target_env)hijacked_context.consumer._M_invoker == SPV_ENV_VULKAN_1_1)) ||
        ((spv_target_env)hijacked_context.consumer._M_invoker == SPV_ENV_VULKAN_1_1_SPIRV_1_4)) ||
       ((spv_target_env)hijacked_context.consumer._M_invoker == SPV_ENV_VULKAN_1_2)) {
      (this->features_).env_allow_localsizeid = false;
    }
    else {
      (this->features_).env_allow_localsizeid = true;
    }
    if (num_words != 0) {
      spv_context_t::spv_context_t((spv_context_t *)local_78,ctx);
      std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
      operator=((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *
                )&hijacked_context.ext_inst_table,&local_79);
      spvBinaryParse((spv_const_context)local_78,this,words,num_words,anon_unknown_11::setHeader,
                     anon_unknown_11::CountInstructions,(spv_diagnostic *)0x0);
      preallocateStorage(this);
      spv_context_t::~spv_context_t((spv_context_t *)local_78);
    }
    anon_unknown_11::UpdateFeaturesBasedOnSpirvVersion(&this->features_,this->version_);
    GetTrivialNameMapper_abi_cxx11_();
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator=(&this->name_mapper_,&local_a0);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::~function(&local_a0);
    if ((this->options_->use_friendly_names & 1U) != 0) {
      MakeUnique<spvtools::FriendlyNameMapper,spv_context_t_const*const&,unsigned_int_const*&,unsigned_long_const&>
                ((spvtools *)&local_a8,&this->context_,&this->words_,&this->num_words_);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      operator=(&this->friendly_mapper_,&local_a8);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      ~unique_ptr(&local_a8);
      this_00 = std::
                unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                ::operator->(&this->friendly_mapper_);
      FriendlyNameMapper::GetNameMapper_abi_cxx11_(&local_c8,this_00);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=(&this->name_mapper_,&local_c8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::~function(&local_c8);
    }
    return;
  }
  __assert_fail("opt && \"Validator options may not be Null.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                ,0xb1,
                "spvtools::val::ValidationState_t::ValidationState_t(const spv_const_context, const spv_const_validator_options, const uint32_t *, const size_t, const uint32_t)"
               );
}

Assistant:

ValidationState_t::ValidationState_t(const spv_const_context ctx,
                                     const spv_const_validator_options opt,
                                     const uint32_t* words,
                                     const size_t num_words,
                                     const uint32_t max_warnings)
    : context_(ctx),
      options_(opt),
      words_(words),
      num_words_(num_words),
      unresolved_forward_ids_{},
      operand_names_{},
      current_layout_section_(kLayoutCapabilities),
      module_functions_(),
      module_capabilities_(),
      module_extensions_(),
      ordered_instructions_(),
      all_definitions_(),
      global_vars_(),
      local_vars_(),
      struct_nesting_depth_(),
      struct_has_nested_blockorbufferblock_struct_(),
      grammar_(ctx),
      addressing_model_(spv::AddressingModel::Max),
      memory_model_(spv::MemoryModel::Max),
      pointer_size_and_alignment_(0),
      sampler_image_addressing_mode_(0),
      in_function_(false),
      num_of_warnings_(0),
      max_num_of_warnings_(max_warnings) {
  assert(opt && "Validator options may not be Null.");

  const auto env = context_->target_env;

  if (spvIsVulkanEnv(env)) {
    // Vulkan 1.1 includes VK_KHR_relaxed_block_layout in core.
    if (env != SPV_ENV_VULKAN_1_0) {
      features_.env_relaxed_block_layout = true;
    }
  }

  // LocalSizeId is only disallowed prior to Vulkan 1.3 without maintenance4.
  switch (env) {
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_VULKAN_1_2:
      features_.env_allow_localsizeid = false;
      break;
    default:
      features_.env_allow_localsizeid = true;
      break;
  }

  // Only attempt to count if we have words, otherwise let the other validation
  // fail and generate an error.
  if (num_words > 0) {
    // Count the number of instructions in the binary.
    // This parse should not produce any error messages. Hijack the context and
    // replace the message consumer so that we do not pollute any state in input
    // consumer.
    spv_context_t hijacked_context = *ctx;
    hijacked_context.consumer = [](spv_message_level_t, const char*,
                                   const spv_position_t&, const char*) {};
    spvBinaryParse(&hijacked_context, this, words, num_words, setHeader,
                   CountInstructions,
                   /* diagnostic = */ nullptr);
    preallocateStorage();
  }
  UpdateFeaturesBasedOnSpirvVersion(&features_, version_);

  name_mapper_ = spvtools::GetTrivialNameMapper();
  if (options_->use_friendly_names) {
    friendly_mapper_ = spvtools::MakeUnique<spvtools::FriendlyNameMapper>(
        context_, words_, num_words_);
    name_mapper_ = friendly_mapper_->GetNameMapper();
  }
}